

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowAboutWindow(bool *p_open)

{
  long lVar1;
  bool bVar2;
  ImGuiID id;
  char *pcVar3;
  float fVar4;
  char *local_48;
  char *local_40;
  ImVec2 local_34;
  ImVec2 local_2c;
  byte local_21;
  ImGuiStyle *pIStack_20;
  bool copy_to_clipboard;
  ImGuiStyle *style;
  ImGuiIO *io;
  bool *p_open_local;
  
  io = (ImGuiIO *)p_open;
  bVar2 = Begin("About Dear ImGui",p_open,0x40);
  if (bVar2) {
    pcVar3 = GetVersion();
    Text("Dear ImGui %s",pcVar3);
    Separator();
    Text("By Omar Cornut and all Dear ImGui contributors.");
    Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");
    Checkbox("Config/Build Information",&ShowAboutWindow::show_config_info);
    if ((ShowAboutWindow::show_config_info & 1U) != 0) {
      style = (ImGuiStyle *)GetIO();
      pIStack_20 = GetStyle();
      ImVec2::ImVec2(&local_2c,0.0,0.0);
      local_21 = Button("Copy to clipboard",&local_2c);
      id = GetID("cfginfos");
      fVar4 = GetTextLineHeightWithSpacing();
      ImVec2::ImVec2(&local_34,0.0,fVar4 * 18.0);
      BeginChildFrame(id,&local_34,4);
      if ((local_21 & 1) != 0) {
        LogToClipboard(-1);
        LogText("```\n");
      }
      Text("Dear ImGui %s (%d)","1.75",0x445c);
      Separator();
      Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d",8,2,0x14);
      Text("define: __cplusplus=%d",0x313e7);
      Text("define: __linux__");
      Text("define: __GNUC__=%d",4);
      Text("define: __clang_version__=%s",
           "19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
          );
      Separator();
      if (*(long *)&style->Colors[1].w == 0) {
        local_40 = "NULL";
      }
      else {
        local_40 = *(char **)&style->Colors[1].w;
      }
      Text("io.BackendPlatformName: %s",local_40);
      lVar1._0_4_ = style->Colors[2].y;
      lVar1._4_4_ = style->Colors[2].z;
      if (lVar1 == 0) {
        local_48 = "NULL";
      }
      else {
        local_48 = *(char **)&style->Colors[2].y;
      }
      Text("io.BackendRendererName: %s",local_48);
      Text("io.ConfigFlags: 0x%08X",(ulong)(uint)style->Alpha);
      if (((uint)style->Alpha & 1) != 0) {
        Text(" NavEnableKeyboard");
      }
      if (((uint)style->Alpha & 2) != 0) {
        Text(" NavEnableGamepad");
      }
      if (((uint)style->Alpha & 4) != 0) {
        Text(" NavEnableSetMousePos");
      }
      if (((uint)style->Alpha & 8) != 0) {
        Text(" NavNoCaptureKeyboard");
      }
      if (((uint)style->Alpha & 0x10) != 0) {
        Text(" NoMouse");
      }
      if (((uint)style->Alpha & 0x20) != 0) {
        Text(" NoMouseCursorChange");
      }
      if (((uint)style->Colors[0].w & 1) != 0) {
        Text("io.MouseDrawCursor");
      }
      if (((uint)style->Colors[0].w & 0x100) != 0) {
        Text("io.ConfigMacOSXBehaviors");
      }
      if (((uint)style->Colors[0].w & 0x10000) != 0) {
        Text("io.ConfigInputTextCursorBlink");
      }
      if (((uint)style->Colors[0].w & 0x1000000) != 0) {
        Text("io.ConfigWindowsResizeFromEdges");
      }
      if (((uint)style->Colors[1].x & 1) != 0) {
        Text("io.ConfigWindowsMoveFromTitleBarOnly");
      }
      if (0.0 <= style->Colors[1].y) {
        Text("io.ConfigWindowsMemoryCompactTimer = %.1ff",(double)style->Colors[1].y);
      }
      Text("io.BackendFlags: 0x%08X",(ulong)(uint)(style->WindowPadding).x);
      if (((uint)(style->WindowPadding).x & 1) != 0) {
        Text(" HasGamepad");
      }
      if (((uint)(style->WindowPadding).x & 2) != 0) {
        Text(" HasMouseCursors");
      }
      if (((uint)(style->WindowPadding).x & 4) != 0) {
        Text(" HasSetMousePos");
      }
      if (((uint)(style->WindowPadding).x & 8) != 0) {
        Text(" RendererHasVtxOffset");
      }
      Separator();
      Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d",
           (ulong)*(uint *)(*(long *)&(style->DisplaySafeAreaPadding).y + 0x40),
           (ulong)*(uint *)(*(long *)&(style->DisplaySafeAreaPadding).y + 4),
           (ulong)*(uint *)(*(long *)&(style->DisplaySafeAreaPadding).y + 0x28),
           (ulong)*(uint *)(*(long *)&(style->DisplaySafeAreaPadding).y + 0x2c));
      Text("io.DisplaySize: %.2f,%.2f",(double)(style->WindowPadding).y,
           (double)style->WindowRounding);
      Text("io.DisplayFramebufferScale: %.2f,%.2f",(double)style->Colors[0].y,
           (double)style->Colors[0].z);
      Separator();
      Text("style.WindowPadding: %.2f,%.2f",(double)(pIStack_20->WindowPadding).x,
           (double)(pIStack_20->WindowPadding).y);
      Text("style.WindowBorderSize: %.2f",(double)pIStack_20->WindowBorderSize);
      Text("style.FramePadding: %.2f,%.2f",(double)(pIStack_20->FramePadding).x,
           (double)(pIStack_20->FramePadding).y);
      Text("style.FrameRounding: %.2f",(double)pIStack_20->FrameRounding);
      Text("style.FrameBorderSize: %.2f",(double)pIStack_20->FrameBorderSize);
      Text("style.ItemSpacing: %.2f,%.2f",(double)(pIStack_20->ItemSpacing).x,
           (double)(pIStack_20->ItemSpacing).y);
      Text("style.ItemInnerSpacing: %.2f,%.2f",(double)(pIStack_20->ItemInnerSpacing).x,
           (double)(pIStack_20->ItemInnerSpacing).y);
      if ((local_21 & 1) != 0) {
        LogText("\n```\n");
        LogFinish();
      }
      EndChildFrame();
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowAboutWindow(bool* p_open)
{
    if (!ImGui::Begin("About Dear ImGui", p_open, ImGuiWindowFlags_AlwaysAutoResize))
    {
        ImGui::End();
        return;
    }
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Separator();
    ImGui::Text("By Omar Cornut and all Dear ImGui contributors.");
    ImGui::Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");

    static bool show_config_info = false;
    ImGui::Checkbox("Config/Build Information", &show_config_info);
    if (show_config_info)
    {
        ImGuiIO& io = ImGui::GetIO();
        ImGuiStyle& style = ImGui::GetStyle();

        bool copy_to_clipboard = ImGui::Button("Copy to clipboard");
        ImGui::BeginChildFrame(ImGui::GetID("cfginfos"), ImVec2(0, ImGui::GetTextLineHeightWithSpacing() * 18), ImGuiWindowFlags_NoMove);
        if (copy_to_clipboard)
        {
            ImGui::LogToClipboard();
            ImGui::LogText("```\n"); // Back quotes will make the text appears without formatting when pasting to GitHub
        }

        ImGui::Text("Dear ImGui %s (%d)", IMGUI_VERSION, IMGUI_VERSION_NUM);
        ImGui::Separator();
        ImGui::Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d", (int)sizeof(size_t), (int)sizeof(ImDrawIdx), (int)sizeof(ImDrawVert));
        ImGui::Text("define: __cplusplus=%d", (int)__cplusplus);
#ifdef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_OBSOLETE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_ALLOCATORS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_ALLOCATORS");
#endif
#ifdef IMGUI_USE_BGRA_PACKED_COLOR
        ImGui::Text("define: IMGUI_USE_BGRA_PACKED_COLOR");
#endif
#ifdef _WIN32
        ImGui::Text("define: _WIN32");
#endif
#ifdef _WIN64
        ImGui::Text("define: _WIN64");
#endif
#ifdef __linux__
        ImGui::Text("define: __linux__");
#endif
#ifdef __APPLE__
        ImGui::Text("define: __APPLE__");
#endif
#ifdef _MSC_VER
        ImGui::Text("define: _MSC_VER=%d", _MSC_VER);
#endif
#ifdef __MINGW32__
        ImGui::Text("define: __MINGW32__");
#endif
#ifdef __MINGW64__
        ImGui::Text("define: __MINGW64__");
#endif
#ifdef __GNUC__
        ImGui::Text("define: __GNUC__=%d", (int)__GNUC__);
#endif
#ifdef __clang_version__
        ImGui::Text("define: __clang_version__=%s", __clang_version__);
#endif
        ImGui::Separator();
        ImGui::Text("io.BackendPlatformName: %s", io.BackendPlatformName ? io.BackendPlatformName : "NULL");
        ImGui::Text("io.BackendRendererName: %s", io.BackendRendererName ? io.BackendRendererName : "NULL");
        ImGui::Text("io.ConfigFlags: 0x%08X", io.ConfigFlags);
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)        ImGui::Text(" NavEnableKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)         ImGui::Text(" NavEnableGamepad");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos)     ImGui::Text(" NavEnableSetMousePos");
        if (io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard)     ImGui::Text(" NavNoCaptureKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)                  ImGui::Text(" NoMouse");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange)      ImGui::Text(" NoMouseCursorChange");
        if (io.MouseDrawCursor)                                         ImGui::Text("io.MouseDrawCursor");
        if (io.ConfigMacOSXBehaviors)                                   ImGui::Text("io.ConfigMacOSXBehaviors");
        if (io.ConfigInputTextCursorBlink)                              ImGui::Text("io.ConfigInputTextCursorBlink");
        if (io.ConfigWindowsResizeFromEdges)                            ImGui::Text("io.ConfigWindowsResizeFromEdges");
        if (io.ConfigWindowsMoveFromTitleBarOnly)                       ImGui::Text("io.ConfigWindowsMoveFromTitleBarOnly");
        if (io.ConfigWindowsMemoryCompactTimer >= 0.0f)                 ImGui::Text("io.ConfigWindowsMemoryCompactTimer = %.1ff", io.ConfigWindowsMemoryCompactTimer);
        ImGui::Text("io.BackendFlags: 0x%08X", io.BackendFlags);
        if (io.BackendFlags & ImGuiBackendFlags_HasGamepad)             ImGui::Text(" HasGamepad");
        if (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors)        ImGui::Text(" HasMouseCursors");
        if (io.BackendFlags & ImGuiBackendFlags_HasSetMousePos)         ImGui::Text(" HasSetMousePos");
        if (io.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)   ImGui::Text(" RendererHasVtxOffset");
        ImGui::Separator();
        ImGui::Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d", io.Fonts->Fonts.Size, io.Fonts->Flags, io.Fonts->TexWidth, io.Fonts->TexHeight);
        ImGui::Text("io.DisplaySize: %.2f,%.2f", io.DisplaySize.x, io.DisplaySize.y);
        ImGui::Text("io.DisplayFramebufferScale: %.2f,%.2f", io.DisplayFramebufferScale.x, io.DisplayFramebufferScale.y);
        ImGui::Separator();
        ImGui::Text("style.WindowPadding: %.2f,%.2f", style.WindowPadding.x, style.WindowPadding.y);
        ImGui::Text("style.WindowBorderSize: %.2f", style.WindowBorderSize);
        ImGui::Text("style.FramePadding: %.2f,%.2f", style.FramePadding.x, style.FramePadding.y);
        ImGui::Text("style.FrameRounding: %.2f", style.FrameRounding);
        ImGui::Text("style.FrameBorderSize: %.2f", style.FrameBorderSize);
        ImGui::Text("style.ItemSpacing: %.2f,%.2f", style.ItemSpacing.x, style.ItemSpacing.y);
        ImGui::Text("style.ItemInnerSpacing: %.2f,%.2f", style.ItemInnerSpacing.x, style.ItemInnerSpacing.y);

        if (copy_to_clipboard)
        {
            ImGui::LogText("\n```\n");
            ImGui::LogFinish();
        }
        ImGui::EndChildFrame();
    }
    ImGui::End();
}